

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

real __thiscall fasttext::Matrix::dotRow(Matrix *this,Vector *vec,int64_t i)

{
  ulong uVar1;
  uint __line;
  ulong uVar2;
  char *__assertion;
  undefined1 auVar3 [16];
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x55;
  }
  else if (i < this->m_) {
    uVar1 = vec->m_;
    if (uVar1 == this->n_) {
      auVar3 = ZEXT816(0) << 0x40;
      for (uVar2 = 0; (~((long)uVar1 >> 0x3f) & uVar1) != uVar2; uVar2 = uVar2 + 1) {
        auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)this->data_[i * uVar1 + uVar2]),
                                 ZEXT416((uint)vec->data_[uVar2]));
      }
      return auVar3._0_4_;
    }
    __assertion = "vec.m_ == n_";
    __line = 0x57;
  }
  else {
    __assertion = "i < m_";
    __line = 0x56;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                ,__line,"real fasttext::Matrix::dotRow(const Vector &, int64_t)");
}

Assistant:

real Matrix::dotRow(const Vector& vec, int64_t i) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.m_ == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += data_[i * n_ + j] * vec.data_[j];
  }
  return d;
}